

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<float>::VariableStatement
          (VariableStatement<float> *this,VariableP<float> *variable,ExprP<float> *value,
          bool isDeclaration)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_01e5b428;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::SharedPtr
            (&(this->m_variable).
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>,
             &variable->super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::SharedPtr
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&this->m_value,
             (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}